

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

ssize_t __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write
          (xml_buffered_writer *this,int __fd,void *__buf,size_t __n)

{
  ulong local_20;
  size_t offset;
  char_t d1_local;
  char_t d0_local;
  xml_buffered_writer *this_local;
  
  local_20 = this->bufsize;
  if (0x7fe < local_20) {
    local_20 = flush(this);
  }
  this->buffer[local_20] = (char_t)__fd;
  this->buffer[local_20 + 1] = (char_t)__buf;
  this->bufsize = local_20 + 2;
  return (ssize_t)this;
}

Assistant:

void write(char_t d0, char_t d1)
		{
			size_t offset = bufsize;
			if (offset > bufcapacity - 2) offset = flush();

			buffer[offset + 0] = d0;
			buffer[offset + 1] = d1;
			bufsize = offset + 2;
		}